

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_udev_p.cpp
# Opt level: O0

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QDeviceDiscoveryUDev *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    handleUDevNotification((QDeviceDiscoveryUDev *)_o);
  }
  return;
}

Assistant:

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceDiscoveryUDev *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->handleUDevNotification(); break;
        default: ;
        }
    }
    (void)_a;
}